

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::ClientImpl::send_(ClientImpl *this,Request *req,Response *res,Error *error)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  id __y;
  id iVar4;
  anon_class_40_5_61c9469f local_158;
  function<bool_(httplib::Stream_&)> local_130;
  anon_class_24_3_3fbdb9c1 local_110;
  function<void_()> local_f8;
  undefined1 local_d8 [8];
  scope_exit se;
  bool close_connection;
  bool ret;
  _Self local_a0;
  _Self local_98;
  reference local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header;
  iterator __end1;
  iterator __begin1;
  Headers *__range1;
  bool shutdown_gracefully;
  bool local_39;
  bool is_alive;
  lock_guard<std::mutex> guard;
  Error *error_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *this_local;
  
  guard._M_device = (mutex_type *)error;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffc8,&this->socket_mutex_);
  this->socket_should_be_closed_when_request_is_done_ = false;
  local_39 = false;
  bVar1 = Socket::is_open(&this->socket_);
  if ((bVar1) && (local_39 = detail::is_socket_alive((this->socket_).sock), !local_39)) {
    (*this->_vptr_ClientImpl[4])(this,&this->socket_,0);
    shutdown_socket(this,&this->socket_);
    close_socket(this,&this->socket_);
  }
  if ((local_39 == false) &&
     (uVar2 = (*this->_vptr_ClientImpl[3])(this,&this->socket_,guard._M_device), (uVar2 & 1) == 0))
  {
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  else {
    if (1 < this->socket_requests_in_flight_) {
      iVar4._M_thread = (this->socket_requests_are_from_thread_)._M_thread;
      __y = std::this_thread::get_id();
      bVar1 = std::operator==(iVar4,__y);
      if (!bVar1) {
        __assert_fail("socket_requests_are_from_thread_ == std::this_thread::get_id()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/httplib.h"
                      ,0x1928,"bool httplib::ClientImpl::send_(Request &, Response &, Error &)");
      }
    }
    this->socket_requests_in_flight_ = this->socket_requests_in_flight_ + 1;
    iVar4 = std::this_thread::get_id();
    (this->socket_requests_are_from_thread_)._M_thread = iVar4._M_thread;
    bVar1 = false;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    __end1 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->default_headers_);
    header = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->default_headers_);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&header), bVar1) {
      local_90 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end1);
      local_98._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&req->headers,&local_90->first);
      local_a0._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&req->headers);
      bVar1 = std::operator==(&local_98,&local_a0);
      if (bVar1) {
        std::
        multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::insert(&req->headers,local_90);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1);
    }
    se._39_1_ = 0;
    se._38_1_ = ~this->keep_alive_ & 1;
    local_110.close_connection = (bool *)&se.field_0x26;
    local_110.ret = (bool *)&se.field_0x27;
    local_110.this = this;
    std::function<void()>::
    function<httplib::ClientImpl::send_(httplib::Request&,httplib::Response&,httplib::Error&)::_lambda()_1_,void>
              ((function<void()> *)&local_f8,&local_110);
    detail::scope_exit::scope_exit((scope_exit *)local_d8,&local_f8);
    std::function<void_()>::~function(&local_f8);
    local_158.close_connection = (bool *)&se.field_0x26;
    local_158.error = (Error *)guard._M_device;
    local_158.this = this;
    local_158.req = req;
    local_158.res = res;
    std::function<bool(httplib::Stream&)>::
    function<httplib::ClientImpl::send_(httplib::Request&,httplib::Response&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
              ((function<bool(httplib::Stream&)> *)&local_130,&local_158);
    iVar3 = (*this->_vptr_ClientImpl[5])(this,&this->socket_,&local_130);
    se._39_1_ = (byte)iVar3 & 1;
    std::function<bool_(httplib::Stream_&)>::~function(&local_130);
    if (((se._39_1_ & 1) == 0) &&
       (((guard._M_device)->super___mutex_base)._M_mutex.__data.__lock == 0)) {
      ((guard._M_device)->super___mutex_base)._M_mutex.__data.__lock = 1;
    }
    this_local._7_1_ = se._39_1_ & 1;
    detail::scope_exit::~scope_exit((scope_exit *)local_d8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool ClientImpl::send_(Request &req, Response &res, Error &error) {
  {
    std::lock_guard<std::mutex> guard(socket_mutex_);

    // Set this to false immediately - if it ever gets set to true by the end of
    // the request, we know another thread instructed us to close the socket.
    socket_should_be_closed_when_request_is_done_ = false;

    auto is_alive = false;
    if (socket_.is_open()) {
      is_alive = detail::is_socket_alive(socket_.sock);
      if (!is_alive) {
        // Attempt to avoid sigpipe by shutting down nongracefully if it seems
        // like the other side has already closed the connection Also, there
        // cannot be any requests in flight from other threads since we locked
        // request_mutex_, so safe to close everything immediately
        const bool shutdown_gracefully = false;
        shutdown_ssl(socket_, shutdown_gracefully);
        shutdown_socket(socket_);
        close_socket(socket_);
      }
    }

    if (!is_alive) {
      if (!create_and_connect_socket(socket_, error)) { return false; }

#ifdef CPPHTTPLIB_OPENSSL_SUPPORT
      // TODO: refactoring
      if (is_ssl()) {
        auto &scli = static_cast<SSLClient &>(*this);
        if (!proxy_host_.empty() && proxy_port_ != -1) {
          auto success = false;
          if (!scli.connect_with_proxy(socket_, res, success, error)) {
            return success;
          }
        }

        if (!scli.initialize_ssl(socket_, error)) { return false; }
      }
#endif
    }

    // Mark the current socket as being in use so that it cannot be closed by
    // anyone else while this request is ongoing, even though we will be
    // releasing the mutex.
    if (socket_requests_in_flight_ > 1) {
      assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
    }
    socket_requests_in_flight_ += 1;
    socket_requests_are_from_thread_ = std::this_thread::get_id();
  }

  for (const auto &header : default_headers_) {
    if (req.headers.find(header.first) == req.headers.end()) {
      req.headers.insert(header);
    }
  }

  auto ret = false;
  auto close_connection = !keep_alive_;

  auto se = detail::scope_exit([&]() {
    // Briefly lock mutex in order to mark that a request is no longer ongoing
    std::lock_guard<std::mutex> guard(socket_mutex_);
    socket_requests_in_flight_ -= 1;
    if (socket_requests_in_flight_ <= 0) {
      assert(socket_requests_in_flight_ == 0);
      socket_requests_are_from_thread_ = std::thread::id();
    }

    if (socket_should_be_closed_when_request_is_done_ || close_connection ||
        !ret) {
      shutdown_ssl(socket_, true);
      shutdown_socket(socket_);
      close_socket(socket_);
    }
  });

  ret = process_socket(socket_, [&](Stream &strm) {
    return handle_request(strm, req, res, close_connection, error);
  });

  if (!ret) {
    if (error == Error::Success) { error = Error::Unknown; }
  }

  return ret;
}